

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall md::Code::bne(Code *this,string *label)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  size_type sVar1;
  mapped_type *this_00;
  key_type_conflict3 local_1c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *label_local;
  Code *this_local;
  
  local_18 = label;
  label_local = (string *)this;
  add_opcode(this,0x6600);
  __str = local_18;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_bytes);
  local_1c = (key_type_conflict3)sVar1;
  this_00 = std::
            map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&this->_pending_branches,&local_1c);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (this_00,__str);
  resolve_branches(this);
  return this;
}

Assistant:

Code& Code::bne(const std::string& label)
{
    this->add_opcode(0x6600);
    _pending_branches[static_cast<uint32_t>(_bytes.size())] = label;
    this->resolve_branches();
    return *this;
}